

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O2

PrintStatus __thiscall
choc::html::HTMLElement::print<std::__cxx11::ostringstream>
          (HTMLElement *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
          size_t indent,PrintStatus status)

{
  pointer pbVar1;
  pointer pHVar2;
  HTMLElement *pHVar3;
  ushort uVar4;
  PrintStatus PVar5;
  ostream *poVar6;
  byte bVar7;
  HTMLElement *c;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer pbVar8;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  HTMLElement *local_38;
  
  bVar7 = status.isAtStartOfLine;
  if (((((ushort)status >> 8 | (ushort)status) & 1) == 0) &&
     (bVar7 = 1, this->contentIsInline == false)) {
    std::operator<<((ostream *)out,'\n');
  }
  bVar7 = (this->contentIsInline ^ 1U) & bVar7;
  if ((bVar7 & 1) != 0) {
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)indent);
    std::operator<<((ostream *)out,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  poVar6 = std::operator<<((ostream *)out,'<');
  std::operator<<(poVar6,(string *)this);
  pbVar1 = (this->properties).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = (this->properties).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1) {
    poVar6 = std::operator<<((ostream *)out,' ');
    std::operator<<(poVar6,(string *)pbVar8);
  }
  std::operator<<((ostream *)out,'>');
  pHVar2 = (this->children).
           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  PVar5.isAtStartOfLine = false;
  PVar5.isFollowingContent = false;
  uVar4 = 0;
  local_38 = this;
  for (this_00 = (this->children).
                 super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                 ._M_impl.super__Vector_impl_data._M_start; pHVar3 = local_38, this_00 != pHVar2;
      this_00 = this_00 + 1) {
    if (this_00->isContent == true) {
      std::operator<<((ostream *)out,(string *)this_00);
      uVar4 = 1;
    }
    else {
      PVar5 = print<std::__cxx11::ostringstream>
                        (this_00,out,indent + 1,(PrintStatus)(uVar4 << 8 | (ushort)PVar5 & 0xff));
      uVar4 = (ushort)PVar5 >> 8;
    }
  }
  if ((((bVar7 & 1) != 0) &&
      ((local_38->children).
       super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl
       .super__Vector_impl_data._M_start !=
       (local_38->children).
       super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl
       .super__Vector_impl_data._M_finish)) && ((uVar4 & 1) == 0)) {
    poVar6 = std::operator<<((ostream *)out,"\n");
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)indent);
    std::operator<<(poVar6,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  poVar6 = std::operator<<((ostream *)out,"</");
  poVar6 = std::operator<<(poVar6,(string *)pHVar3);
  std::operator<<(poVar6,">");
  return (PrintStatus)((ushort)PVar5 & 0xff);
}

Assistant:

PrintStatus print (Output& out, size_t indent, PrintStatus status) const
    {
        if (! (status.isAtStartOfLine || status.isFollowingContent))
        {
            if (! contentIsInline)
                out << '\n';

            status.isAtStartOfLine = true;
        }

        bool openTagIndented = status.isAtStartOfLine && ! contentIsInline;

        if (openTagIndented)
            out << std::string (indent, ' ');

        status.isAtStartOfLine = false;
        out << '<' << name;

        for (auto& p : properties)
            out << ' ' << p;

        out << '>';
        
        status.isFollowingContent = false;

        for (auto& c : children)
        {
            if (c.isContent)
            {
                out << c.name;
                status.isFollowingContent = true;
            }
            else
            {
                status = c.print (out, indent + 1, status);
            }
        }

        if (openTagIndented && ! (children.empty() || status.isFollowingContent))
            out << "\n" << std::string (indent, ' ');

        out << "</" << name << ">";

        status.isFollowingContent = false;
        return status;
    }